

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupTestCase.cpp
# Opt level: O2

void __thiscall SuiteGroupTests::TestremoveGroup::TestremoveGroup(TestremoveGroup *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"removeGroup","GroupTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/GroupTestCase.cpp"
             ,0x4d);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031d8d0;
  return;
}

Assistant:

TEST(removeGroup)
{
  Group parent(5, 100);

  Group child(1, 10);
  child.setField(1, "1");
  child.setField(2, "2");
  parent.addGroup(child);

  parent.removeGroup(child);

  CHECK_EQUAL(0, (int) parent.groupCount(1));

}